

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yang_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  byte bVar1;
  uint attr_value;
  char *__s;
  lys_node *__s_00;
  lyout *plVar2;
  lyout *out_00;
  ushort uVar3;
  LYS_NODE LVar4;
  int iVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  char *pcVar8;
  char *pcVar9;
  lys_node *plVar10;
  lys_when *plVar11;
  int flag_00;
  long lVar12;
  ulong uVar13;
  lys_ext_instance **pplVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  LYS_NODE LVar18;
  int iVar19;
  int local_4c;
  ulong uStack_48;
  int flag_1;
  lyout *local_40;
  int local_34 [2];
  int flag;
  
  uVar17 = (ulong)(uint)level;
  LVar4 = node->nodetype;
  if ((LVar4 & mask) == LYS_UNKNOWN) goto LAB_00174b66;
  if (((LVar4 & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
    return;
  }
  plVar10 = node->parent;
  if (plVar10 == (lys_node *)0x0) {
LAB_00174b51:
    ly_print(out,"\n");
    LVar4 = node->nodetype;
  }
  else if (plVar10->nodetype == LYS_AUGMENT) {
    if (plVar10->child != node) goto LAB_00174b51;
  }
  else if (node->prev->next != (lys_node *)0x0) goto LAB_00174b51;
LAB_00174b66:
  LVar18 = mask & LVar4;
  uStack_48 = uVar17;
  local_40 = out;
  if ((int)LVar18 < 0x100) {
    if ((int)LVar18 < 0x10) {
      switch(LVar18) {
      case LYS_CONTAINER:
        local_34[0] = 0;
        ly_print(out,"%*scontainer %s",(ulong)(uint)(level * 2),"",node->name);
        iVar19 = level + 1;
        yang_print_snode_common(out,iVar19,node,node->module,local_34,1);
        plVar2 = local_40;
        plVar11 = (lys_when *)node[1].name;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            plVar11 = (lys_when *)node[1].name;
          }
          yang_print_when(plVar2,iVar19,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar19,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar17 < node->iffeature_size);
        }
        if (node->padding[2] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_must(local_40,iVar19,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar17 < node->padding[2]);
        }
        plVar2 = local_40;
        pcVar15 = *(char **)&node[1].flags;
        if (pcVar15 != (char *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            pcVar15 = *(char **)&node[1].flags;
          }
          yang_print_substmt(plVar2,iVar19,LYEXT_SUBSTMT_PRESENCE,'\0',pcVar15,node->module,
                             node->ext,(uint)node->ext_size);
        }
        yang_print_snode_common(plVar2,iVar19,node,node->module,local_34,0x74);
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_typedef(local_40,iVar19,node->module,(lys_tpdf *)(node[1].ref + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x80;
          } while (uVar17 < node->padding[3]);
        }
        out = local_40;
        plVar10 = node->child;
        if (plVar10 != (lys_node *)0x0) {
          do {
            if (plVar10->parent == node) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_snode(out,iVar19,plVar10,0x800);
            }
            plVar10 = plVar10->next;
          } while (plVar10 != (lys_node *)0x0);
          plVar10 = node->child;
          if (plVar10 != (lys_node *)0x0) {
            do {
              if (plVar10->parent == node) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_snode(out,iVar19,plVar10,0x903f);
              }
              plVar10 = plVar10->next;
            } while (plVar10 != (lys_node *)0x0);
            plVar10 = node->child;
            if (plVar10 != (lys_node *)0x0) {
              do {
                if (plVar10->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar19,plVar10,0x4000);
                }
                plVar10 = plVar10->next;
              } while (plVar10 != (lys_node *)0x0);
              for (plVar10 = node->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
                if (plVar10->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar19,plVar10,0x80);
                }
              }
            }
          }
        }
        break;
      case LYS_CHOICE:
        local_34[0] = 0;
        ly_print(out,"%*schoice %s",(ulong)(uint)(level * 2),"",node->name);
        iVar19 = level + 1;
        yang_print_snode_common(out,iVar19,node,node->module,local_34,1);
        plVar2 = local_40;
        plVar11 = (lys_when *)node[1].name;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            plVar11 = (lys_when *)node[1].name;
          }
          yang_print_when(plVar2,iVar19,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar19,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar17 < node->iffeature_size);
        }
        out = local_40;
        pcVar15 = node[1].dsc;
        if (pcVar15 != (char *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            pcVar15 = node[1].dsc;
          }
          yang_print_substmt(out,iVar19,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)pcVar15,node->module,
                             node->ext,(uint)node->ext_size);
        }
        yang_print_snode_common(out,iVar19,node,node->module,local_34,0x7c);
        for (plVar10 = node->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
          if (plVar10->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar19,plVar10,0x807f);
          }
        }
        break;
      default:
        goto switchD_00174ba7_caseD_3;
      case LYS_LEAF:
        ly_print(out,"%*sleaf %s {\n");
        uVar16 = level + 1;
        if (node->ext_size != 0) {
          yang_print_extension_instances
                    (out,uVar16,node->module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size)
          ;
        }
        if ((lys_when *)node[1].name != (lys_when *)0x0) {
          yang_print_when(out,uVar16,node->module,(lys_when *)node[1].name);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            yang_print_iffeature
                      (out,uVar16,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar17 < node->iffeature_size);
        }
        yang_print_type(out,uVar16,node->module,(lys_type *)&node[1].ref);
        yang_print_substmt(out,uVar16,LYEXT_SUBSTMT_UNITS,'\0',(char *)node[1].next,node->module,
                           node->ext,(uint)node->ext_size);
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            yang_print_must(out,uVar16,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar17 < node->padding[3]);
        }
        plVar10 = node[1].prev;
        if (plVar10 != (lys_node *)0x0) {
          if ((node->flags & 0x800) != 0) {
            uStack_48 = (ulong)uVar16;
            pcVar15 = strchr((char *)plVar10,0x3a);
            if (pcVar15 == (char *)0x0) {
              __assert_fail("strchr(leaf->dflt, \':\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                            ,0x461,
                            "void yang_print_leaf(struct lyout *, int, const struct lys_node *)");
            }
            plVar6 = lys_node_module(node);
            pcVar15 = plVar6->name;
            __s_00 = node[1].prev;
            pcVar8 = strchr((char *)__s_00,0x3a);
            iVar19 = strncmp((char *)plVar10,pcVar15,(long)pcVar8 - (long)__s_00);
            if (iVar19 == 0) {
              plVar10 = (lys_node *)lydict_insert(node->module->ctx,pcVar8 + 1,0);
            }
            else {
              plVar10 = (lys_node *)transform_json2schema(node->module,(char *)__s_00);
            }
            uVar16 = (uint)uStack_48;
            out = local_40;
          }
          yang_print_substmt(out,uVar16,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar10,node->module,
                             node->ext,(uint)node->ext_size);
          if ((node->flags & 0x800) != 0) {
            lydict_remove(node->module->ctx,(char *)plVar10);
          }
        }
        yang_print_snode_common(out,uVar16,node,node->module,(int *)0x0,0x7c);
        goto LAB_00176a8d;
      case LYS_LEAFLIST:
        ly_print(out,"%*sleaf-list %s {\n");
        uVar16 = level + 1;
        uVar17 = (ulong)uVar16;
        if (node->ext_size != 0) {
          yang_print_extension_instances
                    (out,uVar16,node->module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size)
          ;
        }
        if ((lys_when *)node[1].name != (lys_when *)0x0) {
          yang_print_when(out,uVar16,node->module,(lys_when *)node[1].name);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar13 = 0;
          do {
            yang_print_iffeature
                      (out,uVar16,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar13 < node->iffeature_size);
        }
        yang_print_type(out,uVar16,node->module,(lys_type *)&node[1].ref);
        yang_print_substmt(out,uVar16,LYEXT_SUBSTMT_UNITS,'\0',(char *)node[1].next,node->module,
                           node->ext,(uint)node->ext_size);
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar13 = 0;
          do {
            yang_print_must(out,uVar16,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar13 < node->padding[3]);
        }
        if (node->padding[2] != '\0') {
          uVar13 = 0;
          uStack_48 = uVar17;
          do {
            pcVar15 = *(char **)((node[1].prev)->padding + uVar13 * 8 + -0x1c);
            if ((node->flags & 0x800) != 0) {
              pcVar8 = strchr(pcVar15,0x3a);
              if (pcVar8 == (char *)0x0) {
                __assert_fail("strchr(llist->dflt[i], \':\')",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                              ,0x4ab,
                              "void yang_print_leaflist(struct lyout *, int, const struct lys_node *)"
                             );
              }
              plVar6 = lys_node_module(node);
              pcVar8 = plVar6->name;
              __s = *(char **)((node[1].prev)->padding + uVar13 * 8 + -0x1c);
              pcVar9 = strchr(__s,0x3a);
              iVar19 = strncmp(pcVar15,pcVar8,(long)pcVar9 - (long)__s);
              if (iVar19 == 0) {
                pcVar15 = lydict_insert(node->module->ctx,pcVar9 + 1,0);
                out = local_40;
                uVar17 = uStack_48;
              }
              else {
                pcVar15 = transform_json2schema(node->module,__s);
                out = local_40;
                uVar17 = uStack_48;
              }
            }
            uVar16 = (uint)uVar17;
            yang_print_substmt(out,uVar16,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar13,pcVar15,node->module
                               ,node->ext,(uint)node->ext_size);
            if ((node->flags & 0x800) != 0) {
              lydict_remove(node->module->ctx,pcVar15);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < node->padding[2]);
        }
        yang_print_snode_common(out,uVar16,node,node->module,(int *)0x0,4);
        if (*(uint *)&node[1].priv != 0) {
          yang_print_unsigned(out,uVar16,LYEXT_SUBSTMT_MIN,'\0',node->module,node->ext,
                              (uint)node->ext_size,*(uint *)&node[1].priv);
        }
        attr_value = *(uint *)((long)&node[1].priv + 4);
        if (attr_value != 0) {
          yang_print_unsigned(out,uVar16,LYEXT_SUBSTMT_MAX,'\0',node->module,node->ext,
                              (uint)node->ext_size,attr_value);
        }
        if ((node->flags & 0x100) == 0) {
          iVar19 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
          if (iVar19 != -1) {
            pcVar15 = "system";
            goto LAB_00176729;
          }
        }
        else {
          pcVar15 = "user";
LAB_00176729:
          yang_print_substmt(out,uVar16,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar15,node->module,node->ext,
                             (uint)node->ext_size);
        }
        yang_print_snode_common(out,uVar16,node,node->module,(int *)0x0,0x70);
LAB_00176a8d:
        ly_print(out,"%*s}\n",(ulong)(uint)(level * 2),"");
        return;
      }
    }
    else if ((int)LVar18 < 0x40) {
      if (LVar18 == LYS_LIST) {
        local_34[0] = 0;
        ly_print(out,"%*slist %s",(ulong)(uint)(level * 2),"",node->name);
        iVar19 = level + 1;
        yang_print_snode_common(out,iVar19,node,node->module,local_34,1);
        plVar2 = local_40;
        plVar11 = (lys_when *)node[1].name;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            plVar11 = (lys_when *)node[1].name;
          }
          yang_print_when(plVar2,iVar19,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar19,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar17 < node->iffeature_size);
        }
        if (node->padding[0] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_must(local_40,iVar19,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar17 < node->padding[0]);
        }
        uVar17 = uStack_48;
        if (node->padding[2] != '\0') {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_substmt(local_40,iVar19,LYEXT_SUBSTMT_KEY,'\0',(char *)node[1].module,
                             node->module,node->ext,(uint)node->ext_size);
        }
        if (node->padding[3] != '\0') {
          uVar13 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_unique(local_40,iVar19,(lys_unique *)(node[1].ext + uVar13 * 2));
            pplVar14 = node->ext;
            iVar5 = -1;
            while (iVar5 = lys_ext_iter(pplVar14,node->ext_size,(char)iVar5 + '\x01',
                                        LYEXT_SUBSTMT_UNIQUE), iVar5 != -1) {
              pplVar14 = node->ext;
              if (uVar13 == pplVar14[iVar5]->insubstmt_index) {
                ly_print(local_40," {\n");
                pplVar14 = node->ext;
                do {
                  yang_print_extension_instances
                            (local_40,(int)uVar17 + 2,node->module,LYEXT_SUBSTMT_UNIQUE,
                             (uint8_t)uVar13,pplVar14 + iVar5,1);
                  pplVar14 = node->ext;
                  do {
                    iVar5 = lys_ext_iter(pplVar14,node->ext_size,(char)iVar5 + '\x01',
                                         LYEXT_SUBSTMT_UNIQUE);
                    if (iVar5 == -1) {
                      ly_print(local_40,"%*s}\n",iVar19 * 2,"");
                      goto LAB_0017653a;
                    }
                    pplVar14 = node->ext;
                  } while (uVar13 != pplVar14[iVar5]->insubstmt_index);
                } while( true );
              }
            }
            ly_print(local_40,";\n");
LAB_0017653a:
            uVar13 = uVar13 + 1;
          } while (uVar13 < node->padding[3]);
        }
        plVar2 = local_40;
        yang_print_snode_common(local_40,iVar19,node,node->module,local_34,4);
        uVar16 = *(uint *)&node[1].iffeature;
        if (uVar16 != 0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
            uVar16 = *(uint *)&node[1].iffeature;
          }
          yang_print_unsigned(plVar2,iVar19,LYEXT_SUBSTMT_MIN,'\0',node->module,node->ext,
                              (uint)node->ext_size,uVar16);
        }
        uVar16 = *(uint *)((long)&node[1].iffeature + 4);
        if (uVar16 != 0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
            uVar16 = *(uint *)((long)&node[1].iffeature + 4);
          }
          yang_print_unsigned(plVar2,iVar19,LYEXT_SUBSTMT_MAX,'\0',node->module,node->ext,
                              (uint)node->ext_size,uVar16);
        }
        if ((node->flags & 0x100) == 0) {
          iVar5 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
          if (iVar5 != -1) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(plVar2," {\n");
            }
            plVar6 = node->module;
            bVar1 = node->ext_size;
            pcVar15 = "system";
            goto LAB_001767af;
          }
        }
        else {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
          }
          plVar6 = node->module;
          bVar1 = node->ext_size;
          pcVar15 = "user";
LAB_001767af:
          yang_print_substmt(plVar2,iVar19,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar15,plVar6,node->ext,
                             (uint)bVar1);
        }
        yang_print_snode_common(plVar2,iVar19,node,node->module,local_34,0x70);
        if (node->padding[1] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_typedef(local_40,iVar19,node->module,(lys_tpdf *)(node[1].ref + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x80;
          } while (uVar17 < node->padding[1]);
        }
        out = local_40;
        plVar10 = node->child;
        if (plVar10 != (lys_node *)0x0) {
          do {
            if (plVar10->parent == node) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_snode(out,iVar19,plVar10,0x800);
            }
            plVar10 = plVar10->next;
          } while (plVar10 != (lys_node *)0x0);
          plVar10 = node->child;
          if (plVar10 != (lys_node *)0x0) {
            do {
              if (plVar10->parent == node) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_snode(out,iVar19,plVar10,0x983f);
              }
              plVar10 = plVar10->next;
            } while (plVar10 != (lys_node *)0x0);
            plVar10 = node->child;
            if (plVar10 != (lys_node *)0x0) {
              do {
                if (plVar10->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar19,plVar10,0x4000);
                }
                plVar10 = plVar10->next;
              } while (plVar10 != (lys_node *)0x0);
              for (plVar10 = node->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
                if (plVar10->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar19,plVar10,0x80);
                }
              }
            }
          }
        }
      }
      else {
        if (LVar18 != LYS_ANYXML) {
          return;
        }
LAB_001755c5:
        local_34[0] = 0;
        pcVar15 = "anydata";
        if (LVar4 == LYS_ANYXML) {
          pcVar15 = "anyxml";
        }
        ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar15,node->name);
        iVar19 = level + 1;
        yang_print_snode_common(out,iVar19,node,node->module,local_34,1);
        plVar11 = (lys_when *)node[1].name;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
            plVar11 = (lys_when *)node[1].name;
          }
          yang_print_when(out,iVar19,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar19,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar17 < node->iffeature_size);
        }
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_must(local_40,iVar19,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar17 < node->padding[3]);
        }
        out = local_40;
        yang_print_snode_common(local_40,iVar19,node,node->module,local_34,0x7c);
      }
    }
    else {
      if (LVar18 == LYS_CASE) {
        local_34[0] = 0;
        if ((node->flags & 0x40) == 0) {
          ly_print(out,"%*scase %s",(ulong)(uint)(level * 2),"",node->name);
          level = level + 1;
          yang_print_snode_common(out,level,node,node->module,local_34,1);
          plVar11 = (lys_when *)node[1].name;
          if (plVar11 != (lys_when *)0x0) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
              plVar11 = (lys_when *)node[1].name;
            }
            yang_print_when(out,level,node->module,plVar11);
          }
          yang_print_snode_common(out,level,node,node->module,local_34,0x72);
        }
        else {
          local_34[0] = 1;
        }
        for (plVar10 = node->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
          if (plVar10->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,level,plVar10,0x903f);
          }
        }
        if ((node->flags & 0x40) != 0) {
          return;
        }
        iVar5 = level + -1;
        flag_00 = local_34[0];
        goto LAB_00176986;
      }
      if (LVar18 != LYS_NOTIF) {
        return;
      }
      local_34[0] = 0;
      ly_print(out,"%*snotification %s",(ulong)(uint)(level * 2),"",node->name);
      iVar19 = level + 1;
      yang_print_snode_common(out,iVar19,node,node->module,local_34,3);
      if (node->padding[3] != '\0') {
        lVar12 = 0;
        uVar17 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_must(local_40,iVar19,node->module,(lys_restr *)(node[1].dsc + lVar12));
          uVar17 = uVar17 + 1;
          lVar12 = lVar12 + 0x38;
        } while (uVar17 < node->padding[3]);
      }
      yang_print_snode_common(local_40,iVar19,node,node->module,local_34,0x70);
      if (node->padding[2] != '\0') {
        lVar12 = 0;
        uVar17 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_typedef(local_40,iVar19,node->module,(lys_tpdf *)(node[1].name + lVar12));
          uVar17 = uVar17 + 1;
          lVar12 = lVar12 + 0x80;
        } while (uVar17 < node->padding[2]);
      }
      out = local_40;
      plVar10 = node->child;
      if (plVar10 != (lys_node *)0x0) {
        do {
          if (plVar10->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar19,plVar10,0x800);
          }
          plVar10 = plVar10->next;
        } while (plVar10 != (lys_node *)0x0);
        for (plVar10 = node->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
          if (plVar10->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar19,plVar10,0x903f);
          }
        }
      }
    }
LAB_00176982:
    iVar5 = (int)uStack_48;
    flag_00 = local_34[0];
  }
  else {
    if ((int)LVar18 < 0x800) {
      if (LVar18 != LYS_RPC) {
        if ((LVar18 != LYS_INPUT) && (LVar18 != LYS_OUTPUT)) {
          return;
        }
        ly_print(out,"%*s%s {\n");
        iVar19 = level + 1;
        if (node->ext_size != 0) {
          yang_print_extension_instances
                    (out,iVar19,node->module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size)
          ;
        }
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            yang_print_must(out,iVar19,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar17 < node->padding[3]);
        }
        if (node->padding[2] != '\0') {
          lVar12 = 0;
          uVar17 = 0;
          do {
            yang_print_typedef(out,iVar19,node->module,(lys_tpdf *)(node[1].name + lVar12));
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x80;
          } while (uVar17 < node->padding[2]);
        }
        plVar10 = node->child;
        if (plVar10 != (lys_node *)0x0) {
          do {
            if (plVar10->parent == node) {
              yang_print_snode(out,iVar19,plVar10,0x800);
            }
            plVar10 = plVar10->next;
          } while (plVar10 != (lys_node *)0x0);
          for (plVar10 = node->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
            if (plVar10->parent == node) {
              yang_print_snode(out,iVar19,plVar10,0x903f);
            }
          }
        }
        goto LAB_00176a8d;
      }
LAB_00175920:
      local_34[0] = 0;
      pcVar15 = "action";
      if (LVar4 == LYS_RPC) {
        pcVar15 = "rpc";
      }
      ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar15,node->name);
      iVar19 = level + 1;
      yang_print_snode_common(out,iVar19,node,node->module,local_34,0x73);
      if (node->padding[3] != '\0') {
        lVar12 = 0;
        uVar17 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_typedef(local_40,iVar19,node->module,(lys_tpdf *)(node[1].name + lVar12));
          uVar17 = uVar17 + 1;
          lVar12 = lVar12 + 0x80;
        } while (uVar17 < node->padding[3]);
      }
      out = local_40;
      for (plVar10 = node->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
        if ((plVar10->parent == node) &&
           (((plVar10->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
            ((plVar10->flags & 0x40) == 0)))) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar19,plVar10,0xe00);
        }
      }
      goto LAB_00176982;
    }
    if (0x3fff < (int)LVar18) {
      if (LVar18 != LYS_ACTION) {
        if (LVar18 != LYS_ANYDATA) {
          return;
        }
        goto LAB_001755c5;
      }
      goto LAB_00175920;
    }
    if (LVar18 == LYS_GROUPING) {
      local_34[0] = 0;
      ly_print(out,"%*sgrouping %s",(ulong)(uint)(level * 2),"",node->name);
      iVar19 = level + 1;
      yang_print_snode_common(out,iVar19,node,node->module,local_34,0x71);
      if (node->padding[3] != '\0') {
        lVar12 = 0;
        uVar17 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_typedef(local_40,iVar19,node->module,(lys_tpdf *)(node[1].name + lVar12));
          uVar17 = uVar17 + 1;
          lVar12 = lVar12 + 0x80;
        } while (uVar17 < node->padding[3]);
      }
      plVar2 = local_40;
      plVar10 = node->child;
      iVar5 = (int)uStack_48;
      out = local_40;
      flag_00 = local_34[0];
      if (plVar10 != (lys_node *)0x0) {
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
          }
          yang_print_snode(plVar2,iVar19,plVar10,0x800);
          out_00 = local_40;
          plVar10 = plVar10->next;
        } while (plVar10 != (lys_node *)0x0);
        plVar10 = node->child;
        iVar5 = (int)uStack_48;
        out = local_40;
        flag_00 = local_34[0];
        if (plVar10 != (lys_node *)0x0) {
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out_00," {\n");
            }
            yang_print_snode(out_00,iVar19,plVar10,0x903f);
            plVar2 = local_40;
            plVar10 = plVar10->next;
          } while (plVar10 != (lys_node *)0x0);
          plVar10 = node->child;
          iVar5 = (int)uStack_48;
          out = local_40;
          flag_00 = local_34[0];
          if (plVar10 != (lys_node *)0x0) {
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plVar2," {\n");
              }
              yang_print_snode(plVar2,iVar19,plVar10,0x4000);
              plVar10 = plVar10->next;
            } while (plVar10 != (lys_node *)0x0);
            iVar5 = (int)uStack_48;
            out = local_40;
            flag_00 = local_34[0];
            for (plVar10 = node->child; local_40 = out, local_34[0] = flag_00,
                plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
              if (flag_00 == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_snode(local_40,iVar19,plVar10,0x80);
              out = local_40;
              flag_00 = local_34[0];
            }
          }
        }
      }
    }
    else {
      if (LVar18 != LYS_USES) {
        return;
      }
      local_4c = 0;
      ly_print(out,"%*suses ",(ulong)(uint)(level * 2),"");
      if (node->child != (lys_node *)0x0) {
        plVar6 = lys_node_module(node->child);
        plVar7 = lys_node_module(node);
        if (plVar7 != plVar6) {
          pcVar15 = transform_module_name2import_prefix(node->module,plVar6->name);
          ly_print(out,"%s:",pcVar15);
        }
      }
      ly_print(out,"%s",node->name);
      iVar19 = level + 1;
      yang_print_snode_common(out,iVar19,node,node->module,&local_4c,1);
      plVar11 = (lys_when *)node[1].name;
      if (plVar11 != (lys_when *)0x0) {
        if (local_4c == 0) {
          local_4c = 1;
          ly_print(out," {\n");
          plVar11 = (lys_when *)node[1].name;
        }
        yang_print_when(out,iVar19,node->module,plVar11);
      }
      yang_print_snode_common(out,iVar19,node,node->module,&local_4c,0x72);
      if (node->padding[2] != '\0') {
        iVar5 = (int)uStack_48 + 2;
        uVar17 = 0;
        do {
          if (local_4c == 0) {
            local_4c = 1;
            ly_print(out," {\n");
          }
          plVar6 = node->module;
          pcVar15 = node[1].dsc;
          lVar12 = uVar17 * 0x50;
          plVar10 = (lys_node *)(pcVar15 + lVar12);
          local_34[0] = 0;
          pcVar8 = transform_json2schema(plVar6,*(char **)(pcVar15 + lVar12));
          ly_print(local_40,"%*srefine \"%s\"",(ulong)(uint)(iVar19 * 2),"",pcVar8);
          lydict_remove(plVar6->ctx,pcVar8);
          yang_print_snode_common(local_40,iVar5,plVar10,plVar6,local_34,3);
          if (pcVar15[lVar12 + 0x1e] != '\0') {
            lVar12 = 0;
            uVar13 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40," {\n");
              }
              yang_print_must(local_40,iVar5,plVar6,
                              (lys_restr *)(*(long *)&plVar10->nodetype + lVar12));
              uVar13 = uVar13 + 1;
              lVar12 = lVar12 + 0x38;
            } while (uVar13 < plVar10->padding[2]);
          }
          out = local_40;
          if (*(short *)plVar10->padding == 1) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_PRESENCE,'\0',(char *)plVar10->child,plVar6,
                               plVar10->ext,(uint)plVar10->ext_size);
          }
          if (plVar10->padding[3] != '\0') {
            uVar13 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar13,
                                 *(char **)(plVar10->parent->padding + uVar13 * 8 + -0x1c),plVar6,
                                 plVar10->ext,(uint)plVar10->ext_size);
              uVar13 = uVar13 + 1;
            } while (uVar13 < plVar10->padding[3]);
          }
          if ((plVar10->flags & 1) == 0) {
            if ((plVar10->flags & 2) != 0) {
              pcVar15 = "false";
              goto joined_r0x00175218;
            }
          }
          else {
            pcVar15 = "true";
joined_r0x00175218:
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_CONFIG,'\0',pcVar15,plVar6,plVar10->ext,
                               (uint)plVar10->ext_size);
          }
          if ((plVar10->flags & 0x40) == 0) {
            if ((char)plVar10->flags < '\0') {
              pcVar15 = "false";
              goto joined_r0x0017527f;
            }
          }
          else {
            pcVar15 = "true";
joined_r0x0017527f:
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar15,plVar6,plVar10->ext,
                               (uint)plVar10->ext_size);
          }
          if ((plVar10->padding[0] & 0x18) != 0) {
            uVar3 = plVar10->flags;
            if ((uVar3 & 0x10) != 0) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_unsigned(out,iVar5,LYEXT_SUBSTMT_MIN,'\0',plVar6,plVar10->ext,
                                  (uint)plVar10->ext_size,*(uint *)&plVar10->child);
              uVar3 = plVar10->flags;
            }
            if ((uVar3 & 8) != 0) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              uVar16 = *(uint *)((long)&plVar10->child + 4);
              if (uVar16 == 0) {
                yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar6,plVar10->ext,
                                   (uint)plVar10->ext_size);
              }
              else {
                yang_print_unsigned(out,iVar5,LYEXT_SUBSTMT_MAX,'\0',plVar6,plVar10->ext,
                                    (uint)plVar10->ext_size,uVar16);
              }
            }
          }
          yang_print_snode_common(out,iVar5,plVar10,plVar6,local_34,0x60);
          yang_print_close(out,iVar19,local_34[0]);
          uVar17 = uVar17 + 1;
        } while (uVar17 < node->padding[2]);
      }
      uVar17 = uStack_48;
      if (node->padding[3] != '\0') {
        lVar12 = 0;
        uVar13 = 0;
        do {
          if (local_4c == 0) {
            local_4c = 1;
            ly_print(local_40," {\n");
          }
          yang_print_augment(local_40,iVar19,(lys_node_augment *)(node[1].ref + lVar12));
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x68;
        } while (uVar13 < node->padding[3]);
      }
      iVar5 = (int)uVar17;
      out = local_40;
      flag_00 = local_4c;
    }
  }
LAB_00176986:
  yang_print_close(out,iVar5,flag_00);
switchD_00174ba7_caseD_3:
  return;
}

Assistant:

static void
yang_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    if (node->nodetype & mask) {
        if ((node->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (node->flags & LYS_IMPLICIT)) {
            /* implicit input/output node is not supposed to be printed */
            return;
        } else if (!node->parent ||
                (node->parent->nodetype == LYS_AUGMENT && node != node->parent->child) ||
                (node->parent->nodetype != LYS_AUGMENT && node->prev->next)) {
            /* do not print the blank line before the first data-def node */
            ly_print(out, "\n");
        }
    }

    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yang_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yang_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yang_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yang_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yang_print_list(out, level, node);
        break;
    case LYS_USES:
        yang_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yang_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yang_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yang_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yang_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yang_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yang_print_notif(out, level, node);
        break;
    default:
        break;
    }
}